

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

void crnlib::dxt_fast::refine_endpoints2
               (uint n,color_quad_u8 *pBlock,uint *low16,uint *high16,uint8 *pSelectors,float *axis)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  float *pfVar8;
  byte *pbVar9;
  ulong uVar10;
  uint64 uVar11;
  double dVar12;
  color_quad<unsigned_char,_int> *local_208;
  uint64 cur_error_1;
  bool improved;
  uint64 new_error;
  uint ofs;
  uint64 mask;
  uint local_1d0;
  uint c_1;
  uint h;
  uint l_1;
  uint j;
  uint i_3;
  uint c;
  uint i_2;
  uint64 hash [4];
  uint local_190;
  uint best_h;
  uint best_l;
  int b_1;
  int g_1;
  int r_1;
  uint i_1;
  vec3F probe_high_color;
  int b;
  int g;
  int r;
  uint i;
  vec3F probe_low_color;
  vec3F high_color;
  vec3F low_color;
  color_quad<unsigned_char,_int> local_134;
  color_quad<unsigned_char,_int> local_130;
  color_quad_u8 endpoints [2];
  uint iter;
  uint64 cur_error;
  vec3F initial_ofs;
  vec3F scaled_principle_axis;
  uint num_trials;
  uint num_iters;
  int probe_range;
  uint probe_high [17];
  uint probe_low [17];
  uint cMaxProbeRange;
  float dist_per_trial;
  vec3F principle_axis;
  float l;
  uint64 orig_error;
  float *axis_local;
  uint8 *pSelectors_local;
  uint *high16_local;
  uint *low16_local;
  color_quad_u8 *pBlock_local;
  uint n_local;
  
  register0x00000000 = determine_error(n,pBlock,*low16,*high16,0xffffffffffffffff);
  if (register0x00000000 != 0) {
    dVar12 = std::sqrt((double)(ulong)(uint)(axis[2] * axis[2] + *axis * *axis + axis[1] * axis[1]))
    ;
    principle_axis.m_s[1] = 1.0 / SUB84(dVar12,0);
    vec<3U,_float>::vec((vec<3U,_float> *)&cMaxProbeRange,*axis * principle_axis.m_s[1],
                        axis[1] * principle_axis.m_s[1],axis[2] * principle_axis.m_s[1]);
    crnlib::operator*((crnlib *)(initial_ofs.m_s + 1),(vec<3U,_float> *)&cMaxProbeRange,0.027063293)
    ;
    pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)(initial_ofs.m_s + 1),0);
    *pfVar8 = *pfVar8 * 31.0;
    pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)(initial_ofs.m_s + 1),1);
    *pfVar8 = *pfVar8 * 63.0;
    pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)(initial_ofs.m_s + 1),2);
    *pfVar8 = *pfVar8 * 31.0;
    crnlib::operator*((crnlib *)((long)&cur_error + 4),(vec<3U,_float> *)(initial_ofs.m_s + 1),-8.0)
    ;
    pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)((long)&cur_error + 4),0);
    *pfVar8 = *pfVar8 + 0.5;
    pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)((long)&cur_error + 4),1);
    *pfVar8 = *pfVar8 + 0.5;
    pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)((long)&cur_error + 4),2);
    *pfVar8 = *pfVar8 + 0.5;
    stack0xfffffffffffffed8 = stack0xffffffffffffffc0;
    for (endpoints[0].field_0 =
              (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
              (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
               )0x0; (uint)endpoints[0].field_0 < 4;
        endpoints[0].field_0 =
             (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
             ((int)endpoints[0].field_0 + 1)) {
      local_208 = &local_134;
      do {
        color_quad<unsigned_char,_int>::color_quad(local_208);
        local_208 = local_208 + 1;
      } while (local_208 != endpoints);
      dxt1_block::unpack_color((dxt1_block *)(low_color.m_s + 2),(uint16)*low16,false,0xff);
      color_quad<unsigned_char,_int>::operator=
                (&local_134,(color_quad<unsigned_char,_int> *)(low_color.m_s + 2));
      dxt1_block::unpack_color((dxt1_block *)(low_color.m_s + 1),(uint16)*high16,false,0xff);
      color_quad<unsigned_char,_int>::operator=
                (&local_130,(color_quad<unsigned_char,_int> *)(low_color.m_s + 1));
      pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_134,0);
      bVar1 = *pbVar9;
      pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_134,1);
      bVar2 = *pbVar9;
      pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_134,2);
      vec<3U,_float>::vec((vec<3U,_float> *)(high_color.m_s + 1),(float)bVar1,(float)bVar2,
                          (float)*pbVar9);
      pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_130,0);
      bVar1 = *pbVar9;
      pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_130,1);
      bVar2 = *pbVar9;
      pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_130,2);
      vec<3U,_float>::vec((vec<3U,_float> *)(probe_low_color.m_s + 1),(float)bVar1,(float)bVar2,
                          (float)*pbVar9);
      operator+((crnlib *)&r,(vec<3U,_float> *)(high_color.m_s + 1),
                (vec<3U,_float> *)((long)&cur_error + 4));
      for (g = 0; (uint)g < 0x11; g = g + 1) {
        pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)&r,0);
        dVar12 = std::floor((double)(ulong)(uint)*pfVar8);
        iVar5 = math::clamp<int>((int)SUB84(dVar12,0),0,0x1f);
        pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)&r,1);
        dVar12 = std::floor((double)(ulong)(uint)*pfVar8);
        probe_high_color.m_s[2] = (float)math::clamp<int>((int)SUB84(dVar12,0),0,0x3f);
        pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)&r,2);
        dVar12 = std::floor((double)(ulong)(uint)*pfVar8);
        probe_high_color.m_s[1] = (float)math::clamp<int>((int)SUB84(dVar12,0),0,0x1f);
        probe_low[(ulong)(uint)g - 2] =
             (uint)probe_high_color.m_s[1] | (int)probe_high_color.m_s[2] << 5 | iVar5 << 0xb;
        vec<3U,_float>::operator+=((vec<3U,_float> *)&r,(vec<3U,_float> *)(initial_ofs.m_s + 1));
      }
      operator+((crnlib *)&r_1,(vec<3U,_float> *)(probe_low_color.m_s + 1),
                (vec<3U,_float> *)((long)&cur_error + 4));
      for (g_1 = 0; (uint)g_1 < 0x11; g_1 = g_1 + 1) {
        pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)&r_1,0);
        dVar12 = std::floor((double)(ulong)(uint)*pfVar8);
        iVar5 = math::clamp<int>((int)SUB84(dVar12,0),0,0x1f);
        pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)&r_1,1);
        dVar12 = std::floor((double)(ulong)(uint)*pfVar8);
        iVar6 = math::clamp<int>((int)SUB84(dVar12,0),0,0x3f);
        pfVar8 = vec<3U,_float>::operator[]((vec<3U,_float> *)&r_1,2);
        dVar12 = std::floor((double)(ulong)(uint)*pfVar8);
        uVar7 = math::clamp<int>((int)SUB84(dVar12,0),0,0x1f);
        (&num_iters)[(uint)g_1] = uVar7 | iVar6 << 5 | iVar5 << 0xb;
        vec<3U,_float>::operator+=((vec<3U,_float> *)&r_1,(vec<3U,_float> *)(initial_ofs.m_s + 1));
      }
      local_190 = *low16;
      hash[3]._4_4_ = *high16;
      for (i_3 = 0; i_3 < 4; i_3 = i_3 + 1) {
        (&c + (ulong)i_3 * 2)[0] = 0;
        (&c + (ulong)i_3 * 2)[1] = 0;
      }
      j = local_190 | hash[3]._4_4_ << 0x10;
      j = fast_hash(&j,4);
      *(long *)(&c + (ulong)(j >> 6 & 3) * 2) = 1L << ((byte)j & 0x3f);
      for (l_1 = 0; l_1 < 0x11; l_1 = l_1 + 1) {
        for (h = 0; h < 0x11; h = h + 1) {
          c_1 = probe_low[(ulong)l_1 - 2];
          local_1d0 = (&num_iters)[h];
          if (c_1 < local_1d0) {
            std::swap<unsigned_int>(&c_1,&local_1d0);
          }
          mask._4_4_ = c_1 | local_1d0 << 0x10;
          mask._4_4_ = fast_hash((void *)((long)&mask + 4),4);
          uVar10 = 1L << ((byte)mask._4_4_ & 0x3f);
          uVar7 = mask._4_4_ >> 6 & 3;
          if ((*(ulong *)(&c + (ulong)uVar7 * 2) & uVar10) == 0) {
            *(ulong *)(&c + (ulong)uVar7 * 2) = uVar10 | *(ulong *)(&c + (ulong)uVar7 * 2);
            uVar11 = determine_error(n,pBlock,c_1,local_1d0,stack0xfffffffffffffed8);
            if (uVar11 < stack0xfffffffffffffed8) {
              local_190 = c_1;
              hash[3]._4_4_ = local_1d0;
              stack0xfffffffffffffed8 = uVar11;
            }
          }
        }
      }
      bVar3 = false;
      if ((local_190 != *low16) || (hash[3]._4_4_ != *high16)) {
        *low16 = local_190;
        *high16 = hash[3]._4_4_;
        determine_selectors(n,pBlock,*low16,*high16,pSelectors);
        bVar3 = true;
      }
      bVar4 = refine_endpoints(n,pBlock,low16,high16,pSelectors);
      if (bVar4) {
        bVar3 = true;
        uVar11 = determine_error(n,pBlock,*low16,*high16,0xffffffffffffffff);
        if (uVar11 == 0) {
          return;
        }
      }
      if (!bVar3) {
        return;
      }
    }
  }
  return;
}

Assistant:

static void refine_endpoints2(uint n, const color_quad_u8* pBlock, uint& low16, uint& high16, uint8* pSelectors, float axis[3])
        {
            uint64 orig_error = determine_error(n, pBlock, low16, high16, cUINT64_MAX);
            if (!orig_error)
            {
                return;
            }

            float l = 1.0f / sqrt(axis[0] * axis[0] + axis[1] * axis[1] + axis[2] * axis[2]);
            vec3F principle_axis(axis[0] * l, axis[1] * l, axis[2] * l);

            const float dist_per_trial = 0.027063293f;

            const uint cMaxProbeRange = 8;
            uint probe_low[cMaxProbeRange * 2 + 1];
            uint probe_high[cMaxProbeRange * 2 + 1];

            int probe_range = 8;
            uint num_iters = 4;

            const uint num_trials = probe_range * 2 + 1;

            vec3F scaled_principle_axis(principle_axis * dist_per_trial);
            scaled_principle_axis[0] *= 31.0f;
            scaled_principle_axis[1] *= 63.0f;
            scaled_principle_axis[2] *= 31.0f;
            vec3F initial_ofs(scaled_principle_axis * (float)-probe_range);
            initial_ofs[0] += .5f;
            initial_ofs[1] += .5f;
            initial_ofs[2] += .5f;

            uint64 cur_error = orig_error;

            for (uint iter = 0; iter < num_iters; iter++)
            {
                color_quad_u8 endpoints[2];

                endpoints[0] = dxt1_block::unpack_color((uint16)low16, false);
                endpoints[1] = dxt1_block::unpack_color((uint16)high16, false);

                vec3F low_color(endpoints[0][0], endpoints[0][1], endpoints[0][2]);
                vec3F high_color(endpoints[1][0], endpoints[1][1], endpoints[1][2]);

                vec3F probe_low_color(low_color + initial_ofs);
                for (uint i = 0; i < num_trials; i++)
                {
                    int r = math::clamp((int)floor(probe_low_color[0]), 0, 31);
                    int g = math::clamp((int)floor(probe_low_color[1]), 0, 63);
                    int b = math::clamp((int)floor(probe_low_color[2]), 0, 31);
                    probe_low[i] = b | (g << 5U) | (r << 11U);

                    probe_low_color += scaled_principle_axis;
                }

                vec3F probe_high_color(high_color + initial_ofs);
                for (uint i = 0; i < num_trials; i++)
                {
                    int r = math::clamp((int)floor(probe_high_color[0]), 0, 31);
                    int g = math::clamp((int)floor(probe_high_color[1]), 0, 63);
                    int b = math::clamp((int)floor(probe_high_color[2]), 0, 31);
                    probe_high[i] = b | (g << 5U) | (r << 11U);

                    probe_high_color += scaled_principle_axis;
                }

                uint best_l = low16;
                uint best_h = high16;

                enum
                {
                    cMaxHash = 4
                };
                uint64 hash[cMaxHash];
                for (uint i = 0; i < cMaxHash; i++)
                {
                    hash[i] = 0;
                }

                uint c = best_l | (best_h << 16);
                c = fast_hash(&c, sizeof(c));
                hash[(c >> 6) & 3] = 1ULL << (c & 63);

                for (uint i = 0; i < num_trials; i++)
                {
                    for (uint j = 0; j < num_trials; j++)
                    {
                        uint l = probe_low[i];
                        uint h = probe_high[j];
                        if (l < h)
                        {
                            std::swap(l, h);
                        }

                        uint c = l | (h << 16);
                        c = fast_hash(&c, sizeof(c));
                        uint64 mask = 1ULL << (c & 63);
                        uint ofs = (c >> 6) & 3;
                        if (hash[ofs] & mask)
                        {
                            continue;
                        }

                        hash[ofs] |= mask;

                        uint64 new_error = determine_error(n, pBlock, l, h, cur_error);
                        if (new_error < cur_error)
                        {
                            best_l = l;
                            best_h = h;
                            cur_error = new_error;
                        }
                    }
                }

                bool improved = false;

                if ((best_l != low16) || (best_h != high16))
                {
                    low16 = best_l;
                    high16 = best_h;

                    determine_selectors(n, pBlock, low16, high16, pSelectors);
                    improved = true;
                }

                if (refine_endpoints(n, pBlock, low16, high16, pSelectors))
                {
                    improved = true;

                    uint64 cur_error = determine_error(n, pBlock, low16, high16, cUINT64_MAX);
                    if (!cur_error)
                    {
                        return;
                    }
                }

                if (!improved)
                {
                    break;
                }

            } // iter

            //uint64 end_error = determine_error(n, pBlock, low16, high16, UINT64_MAX);
            //if (end_error > orig_error) DebugBreak();
        }